

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O0

void ApplyInverseTransforms(VP8LDecoder *dec,int start_row,int num_rows,uint32_t *rows)

{
  void *__dest;
  int iVar1;
  int iVar2;
  int iVar3;
  void *in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  VP8LTransform *transform;
  uint32_t *rows_out;
  uint32_t *rows_in;
  int end_row;
  int cache_pixs;
  int n;
  undefined8 local_30;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar4;
  
  iVar1 = *(int *)(in_RDI + 0x84) * in_EDX;
  iVar2 = in_ESI + in_EDX;
  __dest = *(void **)(in_RDI + 0x20);
  local_30 = in_RCX;
  iVar4 = *(int *)(in_RDI + 0x110);
  while (iVar3 = iVar4 + -1, 0 < iVar4) {
    VP8LInverseTransform
              ((VP8LTransform *)CONCAT44(in_ESI,in_EDX),(int)((ulong)in_RCX >> 0x20),(int)in_RCX,
               (uint32_t *)CONCAT44(iVar3,iVar1),
               (uint32_t *)CONCAT44(iVar2,in_stack_ffffffffffffffd8));
    local_30 = __dest;
    iVar4 = iVar3;
  }
  if (local_30 != __dest) {
    memcpy(__dest,local_30,(long)iVar1 << 2);
  }
  return;
}

Assistant:

static void ApplyInverseTransforms(VP8LDecoder* const dec,
                                   int start_row, int num_rows,
                                   const uint32_t* const rows) {
  int n = dec->next_transform_;
  const int cache_pixs = dec->width_ * num_rows;
  const int end_row = start_row + num_rows;
  const uint32_t* rows_in = rows;
  uint32_t* const rows_out = dec->argb_cache_;

  // Inverse transforms.
  while (n-- > 0) {
    VP8LTransform* const transform = &dec->transforms_[n];
    VP8LInverseTransform(transform, start_row, end_row, rows_in, rows_out);
    rows_in = rows_out;
  }
  if (rows_in != rows_out) {
    // No transform called, hence just copy.
    memcpy(rows_out, rows_in, cache_pixs * sizeof(*rows_out));
  }
}